

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

shared_ptr<cxxopts::Value> __thiscall
cxxopts::value<unsigned_short>(cxxopts *this,unsigned_short *t)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cxxopts::Value> sVar1;
  standard_value<unsigned_short> *local_38;
  undefined8 *puStack_30;
  
  local_38 = (standard_value<unsigned_short> *)0x0;
  puStack_30 = (undefined8 *)operator_new(0x88);
  puStack_30[1] = 0x100000001;
  *puStack_30 = &PTR___Sp_counted_ptr_inplace_0013b7d0;
  local_38 = (standard_value<unsigned_short> *)(puStack_30 + 2);
  puStack_30[3] = 0;
  puStack_30[4] = 0;
  puStack_30[5] = 0;
  puStack_30[6] = 0;
  puStack_30[7] = t;
  *(undefined2 *)(puStack_30 + 8) = 0;
  puStack_30[9] = puStack_30 + 0xb;
  puStack_30[10] = 0;
  *(undefined1 *)(puStack_30 + 0xb) = 0;
  puStack_30[0xd] = puStack_30 + 0xf;
  puStack_30[0xe] = 0;
  *(undefined1 *)(puStack_30 + 0xf) = 0;
  puStack_30[2] = &PTR__abstract_value_0013b820;
  std::__shared_ptr<cxxopts::values::standard_value<unsigned_short>,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cxxopts::values::standard_value<unsigned_short>,cxxopts::values::standard_value<unsigned_short>>
            ((__shared_ptr<cxxopts::values::standard_value<unsigned_short>,(__gnu_cxx::_Lock_policy)2>
              *)&local_38,local_38);
  *(undefined8 *)(this + 8) = 0;
  *(standard_value<unsigned_short> **)this = local_38;
  *(undefined8 **)(this + 8) = puStack_30;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<cxxopts::Value>)
         sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
    value(T& t)
    {
        return std::make_shared<values::standard_value<T>>(&t);
    }